

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int fsi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  undefined8 *puVar15;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype wr;
  sunrealtype wl;
  sunrealtype w;
  sunrealtype vr;
  sunrealtype vl;
  sunrealtype v;
  sunrealtype ur;
  sunrealtype ul;
  sunrealtype u;
  sunrealtype dwconst;
  sunrealtype dvconst;
  sunrealtype duconst;
  sunrealtype *dYdata;
  sunrealtype *Ydata;
  sunrealtype dx;
  sunrealtype dw;
  sunrealtype dv;
  sunrealtype du;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  long lVar16;
  void *in_stack_ffffffffffffff38;
  int local_4;
  
  lVar12 = *in_RDX;
  dVar1 = (double)in_RDX[5];
  dVar2 = (double)in_RDX[6];
  dVar3 = (double)in_RDX[7];
  dVar4 = (double)in_RDX[1];
  lVar14 = N_VGetArrayPointer(in_RDI);
  iVar13 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff2c);
  if (iVar13 == 0) {
    puVar15 = (undefined8 *)N_VGetArrayPointer(in_RSI);
    iVar13 = check_retval(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff2c);
    if (iVar13 == 0) {
      N_VConst(0,in_RSI);
      for (lVar16 = 1; lVar16 < lVar12 + -1; lVar16 = lVar16 + 1) {
        dVar5 = *(double *)(lVar14 + lVar16 * 0x18);
        dVar6 = *(double *)(lVar14 + 8 + lVar16 * 0x18);
        dVar7 = *(double *)(lVar14 + 8 + (lVar16 + -1) * 0x18);
        dVar8 = *(double *)(lVar14 + 8 + (lVar16 + 1) * 0x18);
        dVar9 = *(double *)(lVar14 + 0x10 + lVar16 * 0x18);
        dVar10 = *(double *)(lVar14 + 0x10 + (lVar16 + -1) * 0x18);
        dVar11 = *(double *)(lVar14 + 0x10 + (lVar16 + 1) * 0x18);
        puVar15[lVar16 * 3] =
             ((*(double *)(lVar14 + (lVar16 + -1) * 0x18) - (dVar5 + dVar5)) +
             *(double *)(lVar14 + (lVar16 + 1) * 0x18)) * ((dVar1 / dVar4) / dVar4);
        puVar15[lVar16 * 3 + 1] = ((dVar7 - (dVar6 + dVar6)) + dVar8) * ((dVar2 / dVar4) / dVar4);
        puVar15[lVar16 * 3 + 2] = ((dVar10 - (dVar9 + dVar9)) + dVar11) * ((dVar3 / dVar4) / dVar4);
      }
      puVar15[2] = 0;
      puVar15[1] = 0;
      *puVar15 = 0;
      puVar15[(lVar12 + -1) * 3 + 2] = 0;
      puVar15[(lVar12 + -1) * 3 + 1] = 0;
      puVar15[(lVar12 + -1) * 3] = 0;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int fsi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype du     = udata->du;
  sunrealtype dv     = udata->dv;
  sunrealtype dw     = udata->dw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype duconst, dvconst, dwconst, u, ul, ur, v, vl, vr, w, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  duconst = du / dx / dx;
  dvconst = dv / dx / dx;
  dwconst = dw / dx / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u  = Ydata[IDX(i, 0)];
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    v  = Ydata[IDX(i, 1)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    w  = Ydata[IDX(i, 2)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ul - SUN_RCONST(2.0) * u + ur) * duconst;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vl - SUN_RCONST(2.0) * v + vr) * dvconst;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wl - SUN_RCONST(2.0) * w + wr) * dwconst;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}